

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O3

int IDAGetJacTime(void *ida_mem,sunrealtype *t_J)

{
  int iVar1;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDALsMem local_18;
  IDAMem local_10;
  
  iVar1 = idaLs_AccessLMem(ida_mem,"IDAGetJacTime",&local_10,&local_18);
  if (iVar1 == 0) {
    *t_J = local_18->tnlj;
  }
  return iVar1;
}

Assistant:

int IDAGetJacTime(void* ida_mem, sunrealtype* t_J)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure; set output and return */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return retval; }
  *t_J = idals_mem->tnlj;
  return IDALS_SUCCESS;
}